

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaTargetGenerator::AddIncludeFlags
          (cmNinjaTargetGenerator *this,string *languageFlags,string *language)

{
  cmGeneratorTarget *pcVar1;
  cmLocalNinjaGenerator *pcVar2;
  pointer pbVar3;
  bool bVar4;
  string *psVar5;
  cmGlobalNinjaGenerator *this_00;
  undefined1 local_68 [8];
  string includeFlags;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string *language_local;
  string *languageFlags_local;
  cmNinjaTargetGenerator *this_local;
  
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = language;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_38);
  pbVar3 = includes.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  pcVar2 = this->LocalGenerator;
  psVar5 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_(&this->super_cmCommonTargetGenerator);
  cmLocalGenerator::GetIncludeDirectories
            ((cmLocalGenerator *)pcVar2,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_38,pcVar1,pbVar3,psVar5,true);
  pbVar3 = includes.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  pcVar2 = this->LocalGenerator;
  bVar4 = std::operator==(includes.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,"RC");
  psVar5 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_(&this->super_cmCommonTargetGenerator);
  cmLocalGenerator::GetIncludeFlags
            ((string *)local_68,(cmLocalGenerator *)pcVar2,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_38,pcVar1,pbVar3,(bool)(-bVar4 & 1),false,psVar5);
  this_00 = GetGlobalGenerator(this);
  bVar4 = cmGlobalNinjaGenerator::IsGCCOnWindows(this_00);
  if (bVar4) {
    cmsys::SystemTools::ReplaceString((string *)local_68,"\\","/");
  }
  (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
    _vptr_cmLocalGenerator[5])(this->LocalGenerator,languageFlags,local_68);
  std::__cxx11::string::~string((string *)local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_38);
  return;
}

Assistant:

void cmNinjaTargetGenerator::AddIncludeFlags(std::string& languageFlags,
                                             std::string const& language)
{
  std::vector<std::string> includes;
  this->LocalGenerator->GetIncludeDirectories(includes,
                                              this->GeneratorTarget,
                                              language,
                                              this->GetConfigName());
  // Add include directory flags.
  std::string includeFlags =
    this->LocalGenerator->GetIncludeFlags(includes, this->GeneratorTarget,
                                          language,
        language == "RC" ? true : false,  // full include paths for RC
                                          // needed by cmcldeps
                                          false,
                                          this->GetConfigName());
  if (this->GetGlobalGenerator()->IsGCCOnWindows())
    cmSystemTools::ReplaceString(includeFlags, "\\", "/");

  this->LocalGenerator->AppendFlags(languageFlags, includeFlags);
}